

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_PointerUtil.h
# Opt level: O0

void * PDB::Pointer::Offset<void*,void,unsigned_long>(void *anyPointer,unsigned_long howManyBytes)

{
  anon_union_8_3_06f60122 anon_var_0;
  unsigned_long howManyBytes_local;
  void *anyPointer_local;
  
  return (void *)(howManyBytes + (long)anyPointer);
}

Assistant:

PDB_NO_DISCARD inline T Offset(U* anyPointer, V howManyBytes) PDB_NO_EXCEPT
		{
			static_assert(std::is_pointer<T>::value == true, "Type T must be a pointer type.");
			static_assert(std::is_const<typename std::remove_pointer<T>::type>::value == std::is_const<U>::value, "Wrong constness.");

			union
			{
				T as_T;
				U* as_U_ptr;
				char* as_char_ptr;
			};

			as_U_ptr = anyPointer;
			as_char_ptr += howManyBytes;

			return as_T;
		}